

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O0

int Gia_ManEquivSetColors(Gia_Man_t *p,int fVerbose)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  Gia_Obj_t *pObj_00;
  bool bVar7;
  int nDiffs [2];
  int nNodes [2];
  int i;
  Gia_Obj_t *pObj;
  int fVerbose_local;
  Gia_Man_t *p_local;
  
  uVar3 = Gia_ManPoNum(p);
  if ((uVar3 & 1) == 0) {
    Gia_ObjSetColors(p,0);
    nNodes[0] = 0;
    while( true ) {
      iVar4 = Gia_ManPiNum(p);
      bVar7 = false;
      if (nNodes[0] < iVar4) {
        register0x00000000 = Gia_ManCi(p,nNodes[0]);
        bVar7 = register0x00000000 != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      iVar4 = Gia_ObjId(p,stack0xffffffffffffffe0);
      Gia_ObjSetColors(p,iVar4);
      nNodes[0] = nNodes[0] + 1;
    }
    nDiffs[0] = Gia_ManPiNum(p);
    nNodes[0] = 0;
    nDiffs[1] = nDiffs[0];
    while( true ) {
      iVar4 = Gia_ManPoNum(p);
      bVar7 = false;
      if (nNodes[0] < iVar4) {
        register0x00000000 = Gia_ManCo(p,nNodes[0]);
        bVar7 = register0x00000000 != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      pObj_00 = Gia_ObjFanin0(stack0xffffffffffffffe0);
      iVar4 = Gia_ManEquivSetColor_rec(p,pObj_00,nNodes[0] & 1);
      nDiffs[(int)(nNodes[0] & 1U)] = iVar4 + nDiffs[(int)(nNodes[0] & 1U)];
      nNodes[0] = nNodes[0] + 1;
    }
    iVar4 = Gia_ManCandNum(p);
    uVar3 = iVar4 - nDiffs[0];
    iVar4 = Gia_ManCandNum(p);
    iVar4 = iVar4 - nDiffs[1];
    if (fVerbose != 0) {
      uVar5 = Gia_ManCandNum(p);
      iVar2 = nDiffs[1];
      iVar1 = nDiffs[0];
      iVar6 = Gia_ManCandNum(p);
      Abc_Print(1,"CI+AND = %7d  A = %7d  B = %7d  Ad = %7d  Bd = %7d  AB = %7d.\n",(ulong)uVar5,
                (ulong)(uint)iVar1,(ulong)(uint)iVar2,(ulong)uVar3,iVar4,(iVar6 - uVar3) - iVar4);
    }
    return (int)(uVar3 + iVar4) / 2;
  }
  __assert_fail("(Gia_ManPoNum(p) & 1) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                ,0x410,"int Gia_ManEquivSetColors(Gia_Man_t *, int)");
}

Assistant:

int Gia_ManEquivSetColors( Gia_Man_t * p, int fVerbose )
{
    Gia_Obj_t * pObj;
    int i, nNodes[2], nDiffs[2];
    assert( (Gia_ManPoNum(p) & 1) == 0 );
    Gia_ObjSetColors( p, 0 );
    Gia_ManForEachPi( p, pObj, i )
        Gia_ObjSetColors( p, Gia_ObjId(p,pObj) );
    nNodes[0] = nNodes[1] = Gia_ManPiNum(p);
    Gia_ManForEachPo( p, pObj, i )
        nNodes[i&1] += Gia_ManEquivSetColor_rec( p, Gia_ObjFanin0(pObj), i&1 );
//    Gia_ManForEachObj( p, pObj, i )
//        if ( Gia_ObjIsCi(pObj) || Gia_ObjIsAnd(pObj) )
//            assert( Gia_ObjColors(p, i) );
    nDiffs[0] = Gia_ManCandNum(p) - nNodes[0];
    nDiffs[1] = Gia_ManCandNum(p) - nNodes[1];
    if ( fVerbose )
    {
        Abc_Print( 1, "CI+AND = %7d  A = %7d  B = %7d  Ad = %7d  Bd = %7d  AB = %7d.\n",
            Gia_ManCandNum(p), nNodes[0], nNodes[1], nDiffs[0], nDiffs[1],
            Gia_ManCandNum(p) - nDiffs[0] - nDiffs[1] );
    }
    return (nDiffs[0] + nDiffs[1]) / 2;
}